

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

string * __thiscall
deqp::sl::ShaderCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,ShaderCase *this,ValueBlock *valueBlock)

{
  GLSLVersion version;
  string *psVar1;
  DataType DVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  ostream *poVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  char *in_R8;
  long lVar9;
  pointer pVVar10;
  long lVar11;
  bool bVar12;
  ostringstream shader;
  undefined1 auStack_1d8 [15];
  byte local_1c9;
  ValueBlock *local_1c8;
  long local_1c0;
  char *local_1b8;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1c8 = valueBlock;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  version = this->m_targetVersion;
  bVar12 = GLSL_VERSION_150 < version;
  bVar7 = 0xe >> ((byte)version & 0x1f);
  bVar8 = bVar7 | bVar12;
  local_1b8 = "varying";
  if ((bVar7 & 1) != 0 || bVar12) {
    local_1b8 = "in";
  }
  pcVar3 = glu::getGLSLVersionDeclaration(version);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision mediump float;\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"precision mediump int;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  if ((bVar7 & 1) != 0 || bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  }
  genCompareFunctions((ostringstream *)local_1a8,local_1c8,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  pVVar10 = (local_1c8->values).
            super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c9 = bVar8;
  local_1b0 = __return_storage_ptr__;
  if (0 < (int)((ulong)((long)(local_1c8->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10) >> 3) *
          0x38e38e39) {
    local_1c0 = (ulong)((byte)~bVar8 & 1) * 5 + 2;
    lVar9 = 0x28;
    lVar11 = 0;
    do {
      DVar2 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar10->storageType + lVar9));
      pcVar3 = glu::getDataTypeName(DVar2);
      __s = glu::getDataTypeName(*(DataType *)((long)&pVVar10->storageType + lVar9));
      if (*(int *)((long)pVVar10 + lVar9 + -0x28) == 2) {
        DVar2 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar10->storageType + lVar9));
        if (DVar2 == TYPE_FLOAT) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1b8,local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar3 == (char *)0x0) {
            lVar6 = 1;
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
            pcVar3 = " ";
          }
          else {
            sVar4 = strlen(pcVar3);
            lVar6 = 1;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
            pcVar3 = " ";
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_1b8,local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          if (pcVar3 == (char *)0x0) {
            lVar6 = 3;
            std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30)
            ;
            pcVar3 = " v_";
          }
          else {
            sVar4 = strlen(pcVar3);
            lVar6 = 3;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar4);
            pcVar3 = " v_";
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,lVar6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar10 + lVar9 + -0x20),
                            *(long *)((long)pVVar10 + lVar9 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"uniform ",8);
        if (__s == (char *)0x0) {
          std::ios::clear((int)auStack_1d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x30);
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ref_",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)((long)pVVar10 + lVar9 + -0x20),
                            *(long *)((long)pVVar10 + lVar9 + -0x18));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      }
      lVar11 = lVar11 + 1;
      pVVar10 = (local_1c8->values).
                super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x48;
    } while (lVar11 < (int)((ulong)((long)(local_1c8->values).
                                          super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10
                                   ) >> 3) * 0x38e38e39);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  psVar1 = local_1b0;
  bVar7 = local_1c9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  pcVar3 = "gl_FragColor";
  if ((bVar7 & 1) != 0) {
    pcVar3 = "dEQP_FragColor";
  }
  genCompareOp((ostringstream *)local_1a8,pcVar3,local_1c8,"v_",in_R8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

string ShaderCase::genFragmentShader(const ValueBlock& valueBlock)
{
	ostringstream shader;
	const bool	usesInout		 = usesShaderInoutQualifiers(m_targetVersion);
	const bool	customColorOut = usesInout;
	const char*   fragIn		 = usesInout ? "in" : "varying";

	shader << glu::getGLSLVersionDeclaration(m_targetVersion) << "\n";

	shader << "precision mediump float;\n";
	shader << "precision mediump int;\n";
	shader << "\n";

	if (customColorOut)
	{
		shader << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
		shader << "\n";
	}

	genCompareFunctions(shader, valueBlock, true);
	shader << "\n";

	// Declarations (varying, reference for each output).
	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val		  = valueBlock.values[ndx];
		DataType				 floatType	= getDataTypeFloatScalars(val.dataType);
		const char*				 floatTypeStr = getDataTypeName(floatType);
		const char*				 refTypeStr   = getDataTypeName(val.dataType);

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				shader << fragIn << " " << floatTypeStr << " " << val.valueName << ";\n";
			else
				shader << fragIn << " " << floatTypeStr << " v_" << val.valueName << ";\n";

			shader << "uniform " << refTypeStr << " ref_" << val.valueName << ";\n";
		}
	}

	shader << "\n";
	shader << "void main()\n";
	shader << "{\n";

	shader << " ";
	genCompareOp(shader, customColorOut ? "dEQP_FragColor" : "gl_FragColor", valueBlock, "v_", DE_NULL);

	shader << "}\n";
	return shader.str();
}